

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall pbrt::Vertex::Vertex(Vertex *this,MediumInteraction *mi,SampledSpectrum *beta)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  Interval<float> IVar3;
  Interval<float> IVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Float FVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  this->type = Medium;
  uVar1 = *(undefined8 *)((beta->values).values + 2);
  *(undefined8 *)(this->beta).values.values = *(undefined8 *)(beta->values).values;
  *(undefined8 *)((this->beta).values.values + 2) = uVar1;
  IVar3 = (mi->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  IVar4 = (mi->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  FVar11 = (mi->super_Interaction).time;
  fVar12 = (mi->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar13 = (mi->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (mi->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar15 = (mi->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  fVar16 = (mi->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uVar1 = *(undefined8 *)&(mi->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar5 = *(undefined8 *)&(mi->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>.y;
  (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
       (mi->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar3;
  (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar4;
  *(Float *)((long)&this->field_2 + 0x18) = FVar11;
  *(float *)((long)&this->field_2 + 0x1c) = fVar12;
  (((Interaction *)&this->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y = fVar13;
  (((Interaction *)&this->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.z = fVar14;
  (((Interaction *)&this->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.x = fVar15;
  (((Interaction *)&this->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y = fVar16;
  *(undefined8 *)&(this->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
       uVar1;
  *(undefined8 *)&(this->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
       uVar5;
  (this->field_2).ei.super_Interaction.mediumInterface = (mi->super_Interaction).mediumInterface;
  (this->field_2).ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->field_2).ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
  uVar2 = (mi->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
  (this->field_2).ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mi->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->field_2).mi.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits = uVar2;
  uVar1 = *(undefined8 *)((mi->sigma_a).values.values + 2);
  uVar5 = *(undefined8 *)(mi->sigma_s).values.values;
  uVar6 = *(undefined8 *)((mi->sigma_s).values.values + 2);
  uVar7 = *(undefined8 *)(mi->sigma_maj).values.values;
  uVar8 = *(undefined8 *)((mi->sigma_maj).values.values + 2);
  uVar9 = *(undefined8 *)(mi->Le).values.values;
  uVar10 = *(undefined8 *)((mi->Le).values.values + 2);
  *(undefined8 *)((long)&this->field_2 + 0x58) = *(undefined8 *)(mi->sigma_a).values.values;
  *(undefined8 *)((long)&this->field_2 + 0x60) = uVar1;
  *(undefined8 *)((long)&this->field_2 + 0x68) = uVar5;
  *(undefined8 *)((long)&this->field_2 + 0x70) = uVar6;
  *(undefined8 *)((long)&this->field_2 + 0x78) = uVar7;
  *(undefined8 *)((long)&this->field_2 + 0x80) = uVar8;
  *(undefined8 *)((long)&this->field_2 + 0x88) = uVar9;
  *(undefined8 *)((long)&this->field_2 + 0x90) = uVar10;
  BSDF::BSDF(&this->bsdf);
  this->delta = false;
  this->pdfFwd = 0.0;
  this->pdfRev = 0.0;
  return;
}

Assistant:

Vertex(const MediumInteraction &mi, const SampledSpectrum &beta)
        : type(VertexType::Medium), beta(beta), mi(mi) {}